

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int WriteWebP(WebPMux *mux,char *filename)

{
  FILE *__stream;
  WebPMuxError err_00;
  char *pcVar1;
  WebPData *unaff_retaddr;
  WebPMux *in_stack_00000008;
  WebPMuxError err;
  WebPData webp_data;
  int ok;
  WebPData *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  err_00 = WebPMuxAssemble(in_stack_00000008,unaff_retaddr);
  __stream = _stderr;
  if (err_00 == WEBP_MUX_OK) {
    local_4 = WriteData(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    WebPDataClear((WebPData *)0x10538d);
  }
  else {
    pcVar1 = ErrorString(err_00);
    fprintf(__stream,"Error (%s) assembling the WebP file.\n",pcVar1);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int WriteWebP(WebPMux* const mux, const char* filename) {
  int ok;
  WebPData webp_data;
  const WebPMuxError err = WebPMuxAssemble(mux, &webp_data);
  if (err != WEBP_MUX_OK) {
    fprintf(stderr, "Error (%s) assembling the WebP file.\n", ErrorString(err));
    return 0;
  }
  ok = WriteData(filename, &webp_data);
  WebPDataClear(&webp_data);
  return ok;
}